

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O0

void __thiscall
vkt::sparse::anon_unknown_0::SparseAllocationBuilder::SparseAllocationBuilder
          (SparseAllocationBuilder *this)

{
  value_type_conflict2 local_14;
  SparseAllocationBuilder *local_10;
  SparseAllocationBuilder *this_local;
  
  this->m_allocationNdx = 0;
  this->m_resourceChunkNdx = 0;
  this->m_memoryChunkNdx = 0;
  local_10 = this;
  std::
  vector<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind,_std::allocator<vkt::sparse::(anonymous_namespace)::SparseAllocationBuilder::MemoryBind>_>
  ::vector(&this->m_memoryBinds);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->m_chunksPerAllocation);
  local_14 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->m_chunksPerAllocation,&local_14);
  return;
}

Assistant:

SparseAllocationBuilder::SparseAllocationBuilder (void)
	: m_allocationNdx		(0)
	, m_resourceChunkNdx	(0)
	, m_memoryChunkNdx		(0)
{
	m_chunksPerAllocation.push_back(0);
}